

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS
ref_import_i_like_cfd_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *pFVar6;
  void *__ptr;
  long lVar7;
  undefined8 uVar8;
  REF_GLOB n_global;
  char *pcVar9;
  undefined8 uVar10;
  long lVar11;
  void *pvVar12;
  REF_INT n1;
  REF_INT n0;
  REF_INT n2;
  REF_INT nid;
  REF_INT new_cell;
  REF_INT nquad;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT n3;
  REF_INT new_node;
  REF_DBL y;
  REF_DBL x;
  REF_INT nodes [27];
  char line [1024];
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  FILE *local_4e0;
  REF_INT local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  REF_GRID_conflict local_4c8;
  int local_4c0;
  int local_4bc;
  REF_DBL local_4b8;
  REF_DBL local_4b0;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined4 local_498;
  char local_438 [1032];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    pcVar9 = "create grid";
    uVar8 = 0x514;
LAB_001eb0c8:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar8,
           "ref_import_i_like_cfd_grid",(ulong)uVar3,pcVar9);
    return uVar3;
  }
  local_4c8 = *ref_grid_ptr;
  ref_node = local_4c8->node;
  local_4c8->twod = 1;
  pFVar6 = fopen(filename,"r");
  if (pFVar6 == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar9 = "unable to open file";
    uVar8 = 0x51c;
LAB_001eb244:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar8,
           "ref_import_i_like_cfd_grid",pcVar9);
    return 2;
  }
  iVar4 = __isoc99_fscanf(pFVar6,"%d %d %d\n",&local_4cc,&local_4d0,&local_4d4);
  if (iVar4 == 3) {
    n_global = (REF_GLOB)local_4cc;
    local_4e0 = pFVar6;
    if (0 < n_global) {
      lVar11 = 0;
      do {
        iVar4 = __isoc99_fscanf(local_4e0,"%lf %lf",&local_4b0,&local_4b8);
        if (iVar4 != 2) {
          lVar11 = (long)iVar4;
          pcVar9 = "read xy";
          uVar10 = 2;
          uVar8 = 0x522;
          goto LAB_001eb282;
        }
        uVar3 = ref_node_add(ref_node,lVar11,&local_4bc);
        if (uVar3 != 0) {
          pcVar9 = "add node";
          uVar8 = 0x523;
          goto LAB_001eb0c8;
        }
        pRVar1 = ref_node->real;
        lVar7 = (long)local_4bc;
        pRVar1[lVar7 * 0xf] = local_4b0;
        pRVar1[lVar7 * 0xf + 1] = local_4b8;
        pRVar1[lVar7 * 0xf + 2] = 0.0;
        lVar11 = lVar11 + 1;
        n_global = (REF_GLOB)local_4cc;
      } while (lVar11 < n_global);
    }
    uVar3 = ref_node_initialize_n_global(ref_node,n_global);
    if (uVar3 != 0) {
      pcVar9 = "init glob";
      uVar8 = 0x528;
      goto LAB_001eb0c8;
    }
    if (0 < local_4d0) {
      iVar4 = 0;
      do {
        iVar5 = __isoc99_fscanf(local_4e0,"%d %d %d",&local_4ec,&local_4f0,&local_4e8);
        if (iVar5 != 3) {
          lVar11 = (long)iVar5;
          pcVar9 = "read tri";
          uVar10 = 3;
          uVar8 = 0x52d;
          goto LAB_001eb282;
        }
        local_4a8 = local_4ec + -1;
        local_4a4 = local_4f0 + -1;
        local_4a0 = local_4e8 + -1;
        local_49c = 1;
        uVar3 = ref_cell_add(local_4c8->cell[3],&local_4a8,&local_4d8);
        if (uVar3 != 0) {
          pcVar9 = "tri face for tri";
          uVar8 = 0x533;
          goto LAB_001eb0c8;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_4d0);
    }
    if (0 < local_4d4) {
      iVar4 = 0;
      do {
        iVar5 = __isoc99_fscanf(local_4e0,"%d %d %d %d",&local_4ec,&local_4f0,&local_4e8,&local_4c0)
        ;
        if (iVar5 != 4) {
          lVar11 = (long)iVar5;
          pcVar9 = "read quad";
          uVar10 = 4;
          uVar8 = 0x537;
          goto LAB_001eb282;
        }
        local_4a8 = local_4ec + -1;
        local_4a4 = local_4f0 + -1;
        local_4a0 = local_4e8 + -1;
        local_49c = local_4c0 + -1;
        local_498 = 1;
        uVar3 = ref_cell_add(local_4c8->cell[6],&local_4a8,&local_4d8);
        if (uVar3 != 0) {
          pcVar9 = "quad face for qua";
          uVar8 = 0x53e;
          goto LAB_001eb0c8;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < local_4d4);
    }
    pFVar6 = local_4e0;
    iVar5 = __isoc99_fscanf(local_4e0,"%d\n",&local_4e4);
    iVar4 = local_4e4;
    if (iVar5 == 1) {
      if ((long)local_4e4 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x542,"ref_import_i_like_cfd_grid","malloc count of REF_INT negative");
        return 1;
      }
      __ptr = malloc((long)local_4e4 * 4);
      if (__ptr != (void *)0x0) {
        if (iVar4 != 0) {
          lVar11 = 0;
          pvVar12 = __ptr;
          do {
            iVar4 = __isoc99_fscanf(pFVar6,"%d\n",pvVar12);
            if (iVar4 != 1) {
              lVar11 = (long)iVar4;
              pcVar9 = "elements in edge groups";
              uVar10 = 1;
              uVar8 = 0x544;
              goto LAB_001eb282;
            }
            lVar11 = lVar11 + 1;
            pvVar12 = (void *)((long)pvVar12 + 4);
          } while (lVar11 < local_4e4);
          if (0 < local_4e4) {
            lVar11 = 1;
            do {
              pcVar9 = fgets(local_438,0x400,pFVar6);
              if (pcVar9 == (char *)0x0) {
                pcVar9 = "read line for first edge node";
                uVar8 = 0x547;
                goto LAB_001eb244;
              }
              iVar4 = __isoc99_sscanf(local_438,"%d",&local_4ec);
              if (iVar4 != 1) {
                lVar11 = (long)iVar4;
                pcVar9 = "first edge node";
                uVar10 = 1;
                uVar8 = 0x548;
                goto LAB_001eb282;
              }
              if (1 < *(int *)((long)__ptr + lVar11 * 4 + -4)) {
                iVar4 = 1;
                do {
                  pcVar9 = fgets(local_438,0x400,pFVar6);
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = "read line for first edge node";
                    uVar8 = 0x54a;
                    goto LAB_001eb244;
                  }
                  iVar5 = __isoc99_sscanf(local_438,"%d",&local_4f0);
                  if (iVar5 != 1) {
                    lVar11 = (long)iVar5;
                    pcVar9 = "next edge node";
                    uVar10 = 1;
                    uVar8 = 0x54b;
                    goto LAB_001eb282;
                  }
                  local_4a8 = local_4ec + -1;
                  local_4a4 = local_4f0 + -1;
                  local_4a0 = (int)lVar11;
                  uVar3 = ref_cell_add(local_4c8->cell[0],&local_4a8,&local_4d8);
                  if (uVar3 != 0) {
                    pcVar9 = "add edge to edg";
                    uVar8 = 0x550;
                    goto LAB_001eb0c8;
                  }
                  local_4ec = local_4f0;
                  iVar4 = iVar4 + 1;
                  pFVar6 = local_4e0;
                } while (iVar4 < *(int *)((long)__ptr + lVar11 * 4 + -4));
              }
              bVar2 = lVar11 < local_4e4;
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
        }
        free(__ptr);
        fclose(pFVar6);
        return 0;
      }
      pcVar9 = "malloc count of REF_INT NULL";
      uVar8 = 0x542;
      goto LAB_001eb244;
    }
    lVar11 = (long)iVar5;
    pcVar9 = "number of edge groups";
    uVar10 = 1;
    uVar8 = 0x541;
  }
  else {
    lVar11 = (long)iVar4;
    pcVar9 = "read nnode ntri nquad";
    uVar10 = 3;
    uVar8 = 0x51f;
  }
LAB_001eb282:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar8,
         "ref_import_i_like_cfd_grid",pcVar9,uVar10,lVar11);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_import_i_like_cfd_grid(REF_GRID *ref_grid_ptr,
                                                     REF_MPI ref_mpi,
                                                     const char *filename) {
  FILE *file;
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT node, new_node;
  REF_INT nnode, ntri, nquad;
  REF_INT new_cell, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id, nid, i;
  REF_INT *count;
  REF_INT n0, n1, n2, n3;
  REF_DBL x, y;
  char line[1024];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(3, fscanf(file, "%d %d %d\n", &nnode, &ntri, &nquad),
       "read nnode ntri nquad");

  for (node = 0; node < nnode; node++) {
    REIS(2, fscanf(file, "%lf %lf", &x, &y), "read xy");
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    ref_node_xyz(ref_node, 0, new_node) = x;
    ref_node_xyz(ref_node, 1, new_node) = y;
    ref_node_xyz(ref_node, 2, new_node) = 0.0;
  }
  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  id = 1;

  for (cell = 0; cell < ntri; cell++) {
    REIS(3, fscanf(file, "%d %d %d", &n0, &n1, &n2), "read tri");
    nodes[0] = n0 - 1;
    nodes[1] = n1 - 1;
    nodes[2] = n2 - 1;
    nodes[3] = id;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
        "tri face for tri");
  }

  for (cell = 0; cell < nquad; cell++) {
    REIS(4, fscanf(file, "%d %d %d %d", &n0, &n1, &n2, &n3), "read quad");
    nodes[0] = n0 - 1;
    nodes[1] = n1 - 1;
    nodes[2] = n2 - 1;
    nodes[3] = n3 - 1;
    nodes[4] = id;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
        "quad face for qua");
  }

  REIS(1, fscanf(file, "%d\n", &nid), "number of edge groups");
  ref_malloc(count, nid, REF_INT);
  for (id = 1; id <= nid; id++) {
    REIS(1, fscanf(file, "%d\n", &(count[id - 1])), "elements in edge groups");
  }
  for (id = 1; id <= nid; id++) {
    RNS(fgets(line, 1024, file), "read line for first edge node");
    REIS(1, sscanf(line, "%d", &n0), "first edge node");
    for (i = 1; i < count[id - 1]; i++) {
      RNS(fgets(line, 1024, file), "read line for first edge node");
      REIS(1, sscanf(line, "%d", &n1), "next edge node");
      nodes[0] = n0 - 1;
      nodes[1] = n1 - 1;
      nodes[2] = id;
      RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
          "add edge to edg");
      n0 = n1;
    }
  }

  ref_free(count);

  fclose(file);

  return REF_SUCCESS;
}